

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Polynomial<double> * OpenMD::operator+(Polynomial<double> *p1,Polynomial<double> *p2)

{
  bool bVar1;
  const_iterator this;
  pointer ppVar2;
  Polynomial<double> *in_RDI;
  const_iterator i;
  Polynomial<double> *p;
  Polynomial<double> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  Polynomial<double> *pPVar4;
  _Self local_48 [3];
  _Base_ptr local_30;
  const_iterator local_28;
  undefined1 local_19;
  
  local_19 = 0;
  pPVar4 = in_RDI;
  Polynomial<double>::Polynomial
            ((Polynomial<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::_Rb_tree_const_iterator
            (&stack0xffffffffffffffd8);
  this = Polynomial<double>::begin(in_stack_ffffffffffffff88);
  local_30 = this._M_node;
  local_28 = this;
  while( true ) {
    local_48[0]._M_node = (_Base_ptr)Polynomial<double>::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(&stack0xffffffffffffffd8,local_48);
    if (!bVar1) break;
    in_stack_ffffffffffffff88 = (Polynomial<double> *)&stack0xffffffffffffffd8;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x461ffc);
    iVar3 = ppVar2->first;
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)0x46200b);
    Polynomial<double>::addCoefficient
              ((Polynomial<double> *)this._M_node,(int)((ulong)pPVar4 >> 0x20),(double *)in_RDI);
    std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_double>_> *)
               CONCAT44(iVar3,in_stack_ffffffffffffff90));
  }
  return pPVar4;
}

Assistant:

Polynomial<Real> operator+(const Polynomial<Real>& p1,
                             const Polynomial<Real>& p2) {
    Polynomial<Real> p(p1);

    typename Polynomial<Real>::const_iterator i;

    for (i = p2.begin(); i != p2.end(); ++i) {
      p.addCoefficient(i->first, i->second);
    }

    return p;
  }